

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_tag_alias_registry.hpp
# Opt level: O2

TagAliasRegistry * Catch::TagAliasRegistry::get(void)

{
  int iVar1;
  
  if ((get()::instance == '\0') && (iVar1 = __cxa_guard_acquire(&get()::instance), iVar1 != 0)) {
    get::instance.super_ITagAliasRegistry._vptr_ITagAliasRegistry =
         (_func_int **)&PTR__TagAliasRegistry_00171200;
    get::instance.m_registry._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    get::instance.m_registry._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
    ;
    get::instance.m_registry._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &get::instance.m_registry._M_t._M_impl.super__Rb_tree_header._M_header;
    get::instance.m_registry._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         &get::instance.m_registry._M_t._M_impl.super__Rb_tree_header._M_header;
    get::instance.m_registry._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    __cxa_atexit(~TagAliasRegistry,&get::instance,&__dso_handle);
    __cxa_guard_release(&get()::instance);
  }
  return &get::instance;
}

Assistant:

TagAliasRegistry& TagAliasRegistry::get() {
        static TagAliasRegistry instance;
        return instance;

    }